

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

SourceLanguage anon_unknown.dwarf_b0093a::TranslateSourceLanguage(EShSource source,EProfile profile)

{
  EProfile profile_local;
  EShSource source_local;
  
  if (source == EShSourceGlsl) {
    if ((profile - ENoProfile < 2) || (profile == ECompatibilityProfile)) {
      profile_local = ECoreProfile;
    }
    else if (profile == EEsProfile) {
      profile_local = ENoProfile;
    }
    else {
      profile_local = EBadProfile;
    }
  }
  else if (source == EShSourceHlsl) {
    profile_local = ECompatibilityProfile|ENoProfile;
  }
  else {
    profile_local = EBadProfile;
  }
  return profile_local;
}

Assistant:

spv::SourceLanguage TranslateSourceLanguage(glslang::EShSource source, EProfile profile)
{
    switch (source) {
    case glslang::EShSourceGlsl:
        switch (profile) {
        case ENoProfile:
        case ECoreProfile:
        case ECompatibilityProfile:
            return spv::SourceLanguageGLSL;
        case EEsProfile:
            return spv::SourceLanguageESSL;
        default:
            return spv::SourceLanguageUnknown;
        }
    case glslang::EShSourceHlsl:
        return spv::SourceLanguageHLSL;
    default:
        return spv::SourceLanguageUnknown;
    }
}